

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

UDate icu_63::parseDateTimeString(UnicodeString *str,int32_t offset,UErrorCode *status)

{
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  int8_t iVar4;
  char16_t cVar5;
  int32_t iVar6;
  double dVar7;
  UnicodeString *local_58;
  UDate time;
  int32_t maxDayOfMonth;
  int length;
  UBool isValid;
  int32_t iStack_3c;
  UBool isUTC;
  int32_t sec;
  int32_t min;
  int32_t hour;
  int32_t day;
  int32_t month;
  int32_t year;
  UErrorCode *status_local;
  int32_t offset_local;
  UnicodeString *str_local;
  
  UVar3 = ::U_FAILURE(*status);
  if (UVar3 != '\0') {
    return 0.0;
  }
  day = 0;
  hour = 0;
  min = 0;
  sec = 0;
  iStack_3c = 0;
  length = 0;
  bVar2 = false;
  bVar1 = false;
  iVar6 = UnicodeString::length(str);
  if (((iVar6 == 0xf) || (iVar6 == 0x10)) && (cVar5 = UnicodeString::charAt(str,8), cVar5 == L'T'))
  {
    if (iVar6 == 0x10) {
      cVar5 = UnicodeString::charAt(str,0xf);
      if (cVar5 != L'Z') goto LAB_00250086;
      bVar2 = true;
    }
    day = parseAsciiDigits(str,0,4,status);
    iVar6 = parseAsciiDigits(str,4,2,status);
    hour = iVar6 + -1;
    min = parseAsciiDigits(str,6,2,status);
    sec = parseAsciiDigits(str,9,2,status);
    iStack_3c = parseAsciiDigits(str,0xb,2,status);
    length = parseAsciiDigits(str,0xd,2,status);
    UVar3 = ::U_FAILURE(*status);
    if (UVar3 == '\0') {
      iVar4 = Grego::monthLength(day,hour);
      if (((((-1 < day) && (-1 < hour)) && ((hour < 0xc && ((0 < min && (min <= iVar4)))))) &&
          (-1 < sec)) &&
         ((((sec < 0x18 && (-1 < iStack_3c)) && (iStack_3c < 0x3c)) &&
          ((-1 < length && (length < 0x3c)))))) {
        bVar1 = true;
      }
    }
  }
LAB_00250086:
  if (bVar1) {
    dVar7 = Grego::fieldsToDay(day,hour,min);
    local_58 = (UnicodeString *)
               ((double)(sec * 3600000 + iStack_3c * 60000 + length * 1000) + dVar7 * 86400000.0);
    if (!bVar2) {
      local_58 = (UnicodeString *)((double)local_58 - (double)offset);
    }
    str_local = local_58;
  }
  else {
    *status = U_INVALID_FORMAT_ERROR;
    str_local = (UnicodeString *)0x0;
  }
  return (UDate)str_local;
}

Assistant:

static UDate parseDateTimeString(const UnicodeString& str, int32_t offset, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return 0.0;
    }

    int32_t year = 0, month = 0, day = 0, hour = 0, min = 0, sec = 0;
    UBool isUTC = FALSE;
    UBool isValid = FALSE;
    do {
        int length = str.length();
        if (length != 15 && length != 16) {
            // FORM#1 15 characters, such as "20060317T142115"
            // FORM#2 16 characters, such as "20060317T142115Z"
            break;
        }
        if (str.charAt(8) != 0x0054) {
            // charcter "T" must be used for separating date and time
            break;
        }
        if (length == 16) {
            if (str.charAt(15) != 0x005A) {
                // invalid format
                break;
            }
            isUTC = TRUE;
        }

        year = parseAsciiDigits(str, 0, 4, status);
        month = parseAsciiDigits(str, 4, 2, status) - 1;  // 0-based
        day = parseAsciiDigits(str, 6, 2, status);
        hour = parseAsciiDigits(str, 9, 2, status);
        min = parseAsciiDigits(str, 11, 2, status);
        sec = parseAsciiDigits(str, 13, 2, status);

        if (U_FAILURE(status)) {
            break;
        }

        // check valid range
        int32_t maxDayOfMonth = Grego::monthLength(year, month);
        if (year < 0 || month < 0 || month > 11 || day < 1 || day > maxDayOfMonth ||
                hour < 0 || hour >= 24 || min < 0 || min >= 60 || sec < 0 || sec >= 60) {
            break;
        }

        isValid = TRUE;
    } while(false);

    if (!isValid) {
        status = U_INVALID_FORMAT_ERROR;
        return 0.0;
    }
    // Calculate the time
    UDate time = Grego::fieldsToDay(year, month, day) * U_MILLIS_PER_DAY;
    time += (hour * U_MILLIS_PER_HOUR + min * U_MILLIS_PER_MINUTE + sec * U_MILLIS_PER_SECOND);
    if (!isUTC) {
        time -= offset;
    }
    return time;
}